

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O3

int Bmc_ComputeSimDiff(Gia_Man_t *p,Vec_Int_t *vPat,Vec_Int_t *vPat2)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  word *pwVar5;
  Vec_Int_t *pVVar6;
  Gia_Obj_t *pGVar7;
  uint uVar8;
  ulong uVar9;
  int *piVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  
  pVVar4 = p->vCis;
  iVar12 = pVVar4->nSize;
  if ((long)iVar12 < 1) {
    uVar8 = p->nObjs;
    if ((int)uVar8 < 1) goto LAB_0058a8f3;
  }
  else {
    piVar10 = pVVar4->pArray;
    lVar14 = 0;
    do {
      iVar1 = piVar10[lVar14];
      if (((long)iVar1 < 0) || (uVar8 = p->nObjs, (int)uVar8 <= iVar1)) goto LAB_0058aa26;
      if (iVar1 == 0) break;
      if (vPat->nSize <= lVar14) goto LAB_0058aa64;
      if (p->vSims->nSize <= iVar1) goto LAB_0058aa45;
      lVar16 = lVar14 + 1;
      p->vSims->pArray[iVar1] = 2L << ((byte)lVar14 & 0x3f) ^ -(ulong)(vPat->pArray[lVar14] != 0);
      lVar14 = lVar16;
    } while (iVar12 != lVar16);
  }
  pGVar7 = p->pObjs;
  if (pGVar7 != (Gia_Obj_t *)0x0) {
    uVar9 = 0;
    do {
      lVar14 = *(long *)pGVar7;
      uVar11 = (uint)lVar14;
      if ((~uVar11 & 0x1fffffff) != 0 && -1 < (int)uVar11) {
        uVar13 = -(uVar11 & 0x1fffffff) + uVar9;
        iVar12 = (int)uVar13;
        if (iVar12 < 0) goto LAB_0058aa07;
        uVar2 = p->vSims->nSize;
        if ((int)uVar2 <= iVar12) goto LAB_0058aa07;
        uVar15 = -((uint)((ulong)lVar14 >> 0x20) & 0x1fffffff) + uVar9;
        uVar17 = (uint)uVar15;
        if (((int)uVar17 < 0) || (uVar2 <= uVar17)) goto LAB_0058aa07;
        if (uVar2 <= uVar9) goto LAB_0058aa45;
        pwVar5 = p->vSims->pArray;
        pwVar5[uVar9] =
             ((lVar14 << 2) >> 0x3f ^ pwVar5[uVar15 & 0xffffffff]) &
             ((long)((int)(uVar11 * 4) >> 0x1f) ^ pwVar5[uVar13 & 0xffffffff]);
      }
      uVar9 = uVar9 + 1;
      pGVar7 = pGVar7 + 1;
    } while (uVar8 != uVar9);
  }
LAB_0058a8f3:
  pVVar6 = p->vCos;
  iVar12 = pVVar6->nSize;
  if (0 < (long)iVar12) {
    piVar10 = pVVar6->pArray;
    lVar14 = 0;
    do {
      uVar11 = piVar10[lVar14];
      lVar16 = (long)(int)uVar11;
      if ((lVar16 < 0) || ((int)uVar8 <= (int)uVar11)) goto LAB_0058aa26;
      if (p->pObjs == (Gia_Obj_t *)0x0) goto LAB_0058a992;
      uVar2 = *(uint *)(p->pObjs + lVar16);
      uVar17 = uVar11 - (uVar2 & 0x1fffffff);
      if ((int)uVar17 < 0) goto LAB_0058aa07;
      uVar3 = p->vSims->nSize;
      if ((int)uVar3 <= (int)uVar17) goto LAB_0058aa07;
      if (uVar3 <= uVar11) {
LAB_0058aa45:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
      }
      pwVar5 = p->vSims->pArray;
      pwVar5[lVar16] = (long)((int)(uVar2 << 2) >> 0x1f) ^ pwVar5[uVar17];
      lVar14 = lVar14 + 1;
    } while (iVar12 != lVar14);
    if (0 < iVar12) {
      piVar10 = pVVar6->pArray;
LAB_0058a992:
      iVar12 = *piVar10;
      if ((-1 < (long)iVar12) && (iVar12 < (int)uVar8)) {
        if (iVar12 < p->vSims->nSize) {
          uVar9 = p->vSims->pArray[iVar12];
          vPat2->nSize = 0;
          uVar8 = (uint)uVar9;
          if (0 < pVVar4->nSize) {
            lVar14 = 0;
            do {
              lVar14 = lVar14 + 1;
              Vec_IntPush(vPat2,((uint)(uVar9 >> ((byte)lVar14 & 0x3f)) ^ uVar8) & 1);
            } while (lVar14 < p->vCis->nSize);
          }
          return uVar8 & 1;
        }
LAB_0058aa07:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
LAB_0058aa26:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
  }
LAB_0058aa64:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [For a given random pattern, compute output change.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Bmc_ComputeSimDiff( Gia_Man_t * p, Vec_Int_t * vPat, Vec_Int_t * vPat2 )
{
    Gia_Obj_t * pObj;
    int i, Id; word Sim, Sim0, Sim1;
    Gia_ManForEachCiId( p, Id, i )
    {
        Sim = Vec_IntEntry(vPat, i) ? ~(word)0 : 0;
        Sim ^= (word)1 << (i + 1);
        Vec_WrdWriteEntry( p->vSims, Id, Sim );
    }
    Gia_ManForEachAnd( p, pObj, i )
    {
        Sim0 = Vec_WrdEntry( p->vSims, Gia_ObjFaninId0(pObj, i) );
        Sim1 = Vec_WrdEntry( p->vSims, Gia_ObjFaninId1(pObj, i) );
        Sim0 = Gia_ObjFaninC0(pObj) ? ~Sim0 : Sim0;
        Sim1 = Gia_ObjFaninC1(pObj) ? ~Sim1 : Sim1;
        Vec_WrdWriteEntry( p->vSims, i, Sim0 & Sim1 );
    }
    Gia_ManForEachCo( p, pObj, i )
    {
        Id = Gia_ObjId( p, pObj );
        Sim0 = Vec_WrdEntry( p->vSims, Gia_ObjFaninId0(pObj, Id) );
        Sim0 = Gia_ObjFaninC0(pObj) ? ~Sim0 : Sim0;
        Vec_WrdWriteEntry( p->vSims, Id, Sim0 );
    }
    pObj = Gia_ManCo( p, 0 );
    Sim = Vec_WrdEntry( p->vSims, Gia_ObjId(p, pObj) );
    Vec_IntClear( vPat2 );
    for ( i = 1; i <= Gia_ManCiNum(p); i++ )
        Vec_IntPush( vPat2, (int)((Sim & 1) ^ ((Sim >> i) & 1)) );
    return (int)(Sim & 1);
}